

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O0

void __thiscall SerialAnalyzer::WorkerThread(SerialAnalyzer *this)

{
  U64 UVar1;
  byte bVar2;
  U32 UVar3;
  BitState BVar4;
  uint uVar5;
  int iVar6;
  pointer pSVar7;
  AnalyzerChannelData *pAVar8;
  reference pvVar9;
  pointer pSVar10;
  ulong uVar11;
  MarkerType MVar12;
  bool bVar13;
  bool bVar14;
  uint local_bc;
  U32 bit_offset;
  U32 i_2;
  U8 bytes [8];
  FrameV2 frameV2;
  Frame frame;
  U32 num_edges;
  bool is_even;
  U64 msb;
  MarkerType MStack_68;
  U32 i_1;
  U64 marker_location;
  DataBuilder local_50 [8];
  DataBuilder data_builder;
  bool local_43;
  bool mp_is_address;
  bool framing_error;
  ulong uStack_40;
  bool parity_error;
  U64 data;
  U64 frame_starting_sample;
  ulong uStack_28;
  U32 i;
  U64 mask;
  U64 bit_mask;
  U32 bytes_per_transfer;
  U32 bits_per_transfer;
  SerialAnalyzer *this_local;
  
  _bytes_per_transfer = this;
  UVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar3;
  ComputeSampleOffsets(this);
  pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
           operator->(&this->mSettings);
  bit_mask._4_4_ = pSVar7->mBitsPerTransfer;
  pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
           operator->(&this->mSettings);
  if (pSVar7->mSerialMode != Normal) {
    bit_mask._4_4_ = bit_mask._4_4_ + 1;
  }
  pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
           operator->(&this->mSettings);
  bit_mask._0_4_ = pSVar7->mBitsPerTransfer + 7 >> 3;
  pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
           operator->(&this->mSettings);
  if ((pSVar7->mInverted & 1U) == 0) {
    this->mBitHigh = BIT_HIGH;
    this->mBitLow = BIT_LOW;
  }
  else {
    this->mBitHigh = BIT_LOW;
    this->mBitLow = BIT_HIGH;
  }
  mask = 0;
  uStack_28 = 1;
  for (frame_starting_sample._4_4_ = 0; frame_starting_sample._4_4_ < bit_mask._4_4_;
      frame_starting_sample._4_4_ = frame_starting_sample._4_4_ + 1) {
    mask = uStack_28 | mask;
    uStack_28 = uStack_28 << 1;
  }
  std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::operator->
            (&this->mSettings);
  pAVar8 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar8;
  AnalyzerChannelData::TrackMinimumPulseWidth();
  BVar4 = AnalyzerChannelData::GetBitState();
  if (BVar4 == this->mBitLow) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    data = AnalyzerChannelData::GetSampleNumber();
    uStack_40 = 0;
    local_43 = false;
    DataBuilder::DataBuilder(local_50);
    pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
             operator->(&this->mSettings);
    DataBuilder::Reset((ulonglong *)local_50,(ShiftOrder)&stack0xffffffffffffffc0,
                       pSVar7->mShiftOrder);
    _MStack_68 = data;
    for (msb._4_4_ = 0; msb._4_4_ < bit_mask._4_4_; msb._4_4_ = msb._4_4_ + 1) {
      pAVar8 = this->mSerial;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&this->mSampleOffsets,(ulong)msb._4_4_);
      AnalyzerChannelData::Advance((uint)pAVar8);
      AnalyzerChannelData::GetBitState();
      DataBuilder::AddBit((BitState)local_50);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->mSampleOffsets,(ulong)msb._4_4_);
      _MStack_68 = _MStack_68 + *pvVar9;
      pSVar10 = std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                ::operator->(&this->mResults);
      std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
      operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar10,(MarkerType)_MStack_68,(Channel *)0x0);
    }
    pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
             operator->(&this->mSettings);
    if ((pSVar7->mInverted & 1U) == 1) {
      uStack_40 = (uStack_40 ^ 0xffffffffffffffff) & mask;
    }
    pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
             operator->(&this->mSettings);
    if (pSVar7->mSerialMode != Normal) {
      uVar11 = uStack_40 >> ((char)bit_mask._4_4_ - 1U & 0x3f) & 1;
      pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      if (pSVar7->mSerialMode == MpModeMsbOneMeansAddress) {
        local_43 = uVar11 == 1;
      }
      else {
        pSVar7 = std::
                 unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
                 operator->(&this->mSettings);
        local_43 = pSVar7->mSerialMode == MpModeMsbZeroMeansAddress && uVar11 == 0;
      }
      uStack_40 = mask >> 1 & uStack_40;
    }
    bVar13 = false;
    pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
             operator->(&this->mSettings);
    if (pSVar7->mParity != None) {
      AnalyzerChannelData::Advance((uint)this->mSerial);
      uVar5 = AnalyzerHelpers::GetOnesCount(uStack_40);
      bVar2 = AnalyzerHelpers::IsEven((ulong)uVar5);
      pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      if (pSVar7->mParity == Even) {
        if ((bVar2 & 1) == 1) {
          BVar4 = AnalyzerChannelData::GetBitState();
          bVar13 = BVar4 != this->mBitLow;
        }
        else {
          BVar4 = AnalyzerChannelData::GetBitState();
          bVar13 = BVar4 != this->mBitHigh;
        }
      }
      else if ((bVar2 & 1) == 0) {
        BVar4 = AnalyzerChannelData::GetBitState();
        bVar13 = BVar4 != this->mBitLow;
      }
      else {
        BVar4 = AnalyzerChannelData::GetBitState();
        bVar13 = BVar4 != this->mBitHigh;
      }
      MVar12 = MStack_68 + this->mParityBitOffset;
      pSVar10 = std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                ::operator->(&this->mResults);
      std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
      operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar10,MVar12,(Channel *)0x2);
      MStack_68 = MVar12;
    }
    AnalyzerChannelData::Advance((uint)this->mSerial);
    BVar4 = AnalyzerChannelData::GetBitState();
    if (BVar4 == this->mBitHigh) {
      iVar6 = AnalyzerChannelData::Advance((uint)this->mSerial);
      bVar14 = iVar6 != 0;
    }
    else {
      bVar14 = true;
    }
    if (bVar14) {
      MVar12 = MStack_68 + this->mStartOfStopBitOffset;
      pSVar10 = std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                ::operator->(&this->mResults);
      std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
      operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar10,MVar12,(Channel *)0x7);
      if (this->mEndOfStopBitOffset != 0) {
        UVar3 = this->mEndOfStopBitOffset;
        pSVar10 = std::
                  unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::
                  operator->(&this->mResults);
        std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
        operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)pSVar10,MVar12 + UVar3,(Channel *)0x7);
      }
    }
    Frame::Frame((Frame *)&frameV2);
    _frameV2 = data;
    AnalyzerChannelData::GetSampleNumber();
    if (local_43) {
      std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::
      operator->(&this->mResults);
      AnalyzerResults::CommitPacketAndStartNewPacket();
    }
    pSVar10 = std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::
              operator->(&this->mResults);
    AnalyzerResults::AddFrame((Frame *)pSVar10);
    FrameV2::FrameV2((FrameV2 *)bytes);
    for (local_bc = 0; local_bc < (uint)bit_mask; local_bc = local_bc + 1) {
      *(char *)((long)&bit_offset + (ulong)local_bc) =
           (char)(uStack_40 >> ((((char)(uint)bit_mask - (char)local_bc) + -1) * '\b' & 0x3fU));
    }
    FrameV2::AddByteArray((char *)bytes,(uchar *)"data",(ulonglong)&bit_offset);
    if (bVar13) {
      FrameV2::AddString((char *)bytes,"error");
    }
    else if (bVar14) {
      FrameV2::AddString((char *)bytes,"error");
    }
    pSVar7 = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
             operator->(&this->mSettings);
    if (pSVar7->mSerialMode != Normal) {
      FrameV2::AddBoolean((char *)bytes,true);
    }
    pSVar10 = std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::
              operator->(&this->mResults);
    UVar1 = data;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pSVar10,(char *)bytes,0x115040,UVar1);
    std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::operator->
              (&this->mResults);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
    if ((bVar14) && (BVar4 = AnalyzerChannelData::GetBitState(), BVar4 == this->mBitLow)) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    FrameV2::~FrameV2((FrameV2 *)bytes);
    Frame::~Frame((Frame *)&frameV2);
    DataBuilder::~DataBuilder(local_50);
  } while( true );
}

Assistant:

void SerialAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    ComputeSampleOffsets();

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer++;

    // used for HLA byte count, this should not include an extra bit for MP/MDB
    const U32 bytes_per_transfer = ( mSettings->mBitsPerTransfer + 7 ) / 8;

    if( mSettings->mInverted == false )
    {
        mBitHigh = BIT_HIGH;
        mBitLow = BIT_LOW;
    }
    else
    {
        mBitHigh = BIT_LOW;
        mBitLow = BIT_HIGH;
    }

    U64 bit_mask = 0;
    U64 mask = 0x1ULL;
    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        bit_mask |= mask;
        mask <<= 1;
    }

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );
    mSerial->TrackMinimumPulseWidth();

    if( mSerial->GetBitState() == mBitLow )
        mSerial->AdvanceToNextEdge();

    for( ;; )
    {
        // we're starting high. (we'll assume that we're not in the middle of a byte.)

        mSerial->AdvanceToNextEdge();

        // we're now at the beginning of the start bit.  We can start collecting the data.
        U64 frame_starting_sample = mSerial->GetSampleNumber();

        U64 data = 0;
        bool parity_error = false;
        bool framing_error = false;
        bool mp_is_address = false;

        DataBuilder data_builder;
        data_builder.Reset( &data, mSettings->mShiftOrder, bits_per_transfer );
        U64 marker_location = frame_starting_sample;

        for( U32 i = 0; i < bits_per_transfer; i++ )
        {
            mSerial->Advance( mSampleOffsets[ i ] );
            data_builder.AddBit( mSerial->GetBitState() );

            marker_location += mSampleOffsets[ i ];
            mResults->AddMarker( marker_location, AnalyzerResults::Dot, mSettings->mInputChannel );
        }

        if( mSettings->mInverted == true )
            data = ( ~data ) & bit_mask;

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            // extract the MSB
            U64 msb = data >> ( bits_per_transfer - 1 );
            msb &= 0x1;
            if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbOneMeansAddress )
            {
                mp_is_address = msb == 0x1;
            }
            else if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbZeroMeansAddress )
            {
                mp_is_address = msb == 0x0;
            }
            // now remove the msb.
            data &= ( bit_mask >> 1 );
        }

        parity_error = false;

        if( mSettings->mParity != AnalyzerEnums::None )
        {
            mSerial->Advance( mParityBitOffset );
            bool is_even = AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( data ) );

            if( mSettings->mParity == AnalyzerEnums::Even )
            {
                if( is_even == true )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity even.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity even.
                        parity_error = true;
                }
            }
            else // if( mSettings->mParity == AnalyzerEnums::Odd )
            {
                if( is_even == false )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity odd.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity odd.
                        parity_error = true;
                }
            }

            marker_location += mParityBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::Square, mSettings->mInputChannel );
        }

        // now we must determine if there is a framing error.
        framing_error = false;

        mSerial->Advance( mStartOfStopBitOffset );

        if( mSerial->GetBitState() != mBitHigh )
        {
            framing_error = true;
        }
        else
        {
            U32 num_edges = mSerial->Advance( mEndOfStopBitOffset );
            if( num_edges != 0 )
                framing_error = true;
        }

        if( framing_error == true )
        {
            marker_location += mStartOfStopBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );

            if( mEndOfStopBitOffset != 0 )
            {
                marker_location += mEndOfStopBitOffset;
                mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );
            }
        }

        // ok now record the value!
        // note that we're not using the mData2 or mType fields for anything, so we won't bother to set them.
        Frame frame;
        frame.mStartingSampleInclusive = static_cast<S64>( frame_starting_sample );
        frame.mEndingSampleInclusive = static_cast<S64>( mSerial->GetSampleNumber() );
        frame.mData1 = data;
        frame.mFlags = 0;
        if( parity_error == true )
            frame.mFlags |= PARITY_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( framing_error == true )
            frame.mFlags |= FRAMING_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( mp_is_address == true )
            frame.mFlags |= MP_MODE_ADDRESS_FLAG;

        if( mp_is_address == true )
            mResults->CommitPacketAndStartNewPacket();

        mResults->AddFrame( frame );

        FrameV2 frameV2;

        U8 bytes[ 8 ];
        for( U32 i = 0; i < bytes_per_transfer; ++i )
        {
            auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
            bytes[ i ] = static_cast<U8>( data >> bit_offset );
        }
        frameV2.AddByteArray( "data", bytes, bytes_per_transfer );

        if( parity_error )
        {
            frameV2.AddString( "error", "parity" );
        }
        else if( framing_error )
        {
            frameV2.AddString( "error", "framing" );
        }

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            frameV2.AddBoolean( "address", mp_is_address );
        }

        mResults->AddFrameV2( frameV2, "data", frame_starting_sample, mSerial->GetSampleNumber() );

        mResults->CommitResults();

        ReportProgress( frame.mEndingSampleInclusive );
        CheckIfThreadShouldExit();

        if( framing_error == true ) // if we're still low, let's fix that for the next round.
        {
            if( mSerial->GetBitState() == mBitLow )
                mSerial->AdvanceToNextEdge();
        }
    }
}